

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter.h
# Opt level: O1

void __thiscall
spdlog::pattern_formatter::handle_flag_(pattern_formatter *this,char flag,padding_info padding)

{
  pointer __p;
  pad_side pVar1;
  size_t sVar2;
  undefined7 in_register_00000031;
  __single_object unknown_flag;
  _Head_base<0UL,_spdlog::details::flag_formatter_*,_false> local_30;
  _Head_base<0UL,_spdlog::details::flag_formatter_*,_false> local_28;
  
  sVar2 = padding.width_;
  pVar1 = padding.side_;
  switch((int)CONCAT71(in_register_00000031,flag)) {
  case 0x23:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar2;
    ((local_30._M_head_impl)->padinfo_).side_ = pVar1;
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001e88f0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x24:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar2;
    ((local_30._M_head_impl)->padinfo_).side_ = pVar1;
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001e8830;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x25:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x20);
    ((local_30._M_head_impl)->padinfo_).width_ = 0;
    ((local_30._M_head_impl)->padinfo_).side_ = left;
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001e8930;
    *(undefined1 *)&local_30._M_head_impl[1]._vptr_flag_formatter = 0x25;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  default:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x38);
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)0x0;
    ((local_30._M_head_impl)->padinfo_).width_ = 0;
    *(undefined8 *)&((local_30._M_head_impl)->padinfo_).side_ = 0;
    local_30._M_head_impl[1]._vptr_flag_formatter = (_func_int **)0x0;
    local_30._M_head_impl[1].padinfo_.width_ = 0;
    *(undefined8 *)&local_30._M_head_impl[1].padinfo_.side_ = 0;
    local_30._M_head_impl[2]._vptr_flag_formatter = (_func_int **)0x0;
    ((local_30._M_head_impl)->padinfo_).width_ = 0;
    ((local_30._M_head_impl)->padinfo_).side_ = left;
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__aggregate_formatter_001e8970
    ;
    local_30._M_head_impl[1]._vptr_flag_formatter =
         (_func_int **)&local_30._M_head_impl[1].padinfo_.side_;
    local_30._M_head_impl[1].padinfo_.width_ = 0;
    *(undefined1 *)&local_30._M_head_impl[1].padinfo_.side_ = left;
    std::__cxx11::string::push_back((char)local_30._M_head_impl + '\x18');
    std::__cxx11::string::push_back((char)local_30._M_head_impl + '\x18');
    local_28._M_head_impl = local_30._M_head_impl;
    local_30._M_head_impl = (flag_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_28);
    if (local_28._M_head_impl != (flag_formatter *)0x0) {
      (*(local_28._M_head_impl)->_vptr_flag_formatter[1])();
    }
    if ((aggregate_formatter *)local_30._M_head_impl == (aggregate_formatter *)0x0) {
      return;
    }
    std::default_delete<spdlog::details::aggregate_formatter>::operator()
              ((default_delete<spdlog::details::aggregate_formatter> *)&local_30,
               (aggregate_formatter *)local_30._M_head_impl);
    return;
  case 0x2b:
    local_30._M_head_impl = (flag_formatter *)operator_new(0xc0);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar2;
    ((local_30._M_head_impl)->padinfo_).side_ = pVar1;
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__full_formatter_001e7de0;
    local_30._M_head_impl[1]._vptr_flag_formatter = (_func_int **)0x0;
    *(undefined8 *)&local_30._M_head_impl[1].padinfo_.side_ = 0;
    local_30._M_head_impl[2]._vptr_flag_formatter = (_func_int **)0x0;
    local_30._M_head_impl[1].padinfo_.width_ = (size_t)&PTR_grow_001e7e58;
    *(pad_side **)&local_30._M_head_impl[1].padinfo_.side_ =
         &local_30._M_head_impl[2].padinfo_.side_;
    local_30._M_head_impl[2].padinfo_.width_ = 0x80;
    local_28._M_head_impl = (flag_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    if (local_30._M_head_impl != (flag_formatter *)0x0) {
      (*(local_30._M_head_impl)->_vptr_flag_formatter[1])();
    }
    local_30._M_head_impl = (flag_formatter *)0x0;
    if ((full_formatter *)local_28._M_head_impl == (full_formatter *)0x0) {
      return;
    }
    std::default_delete<spdlog::details::full_formatter>::operator()
              ((default_delete<spdlog::details::full_formatter> *)&local_28,
               (full_formatter *)local_28._M_head_impl);
    return;
  case 0x40:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar2;
    ((local_30._M_head_impl)->padinfo_).side_ = pVar1;
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001e8870;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x41:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar2;
    ((local_30._M_head_impl)->padinfo_).side_ = pVar1;
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001e8230;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x42:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar2;
    ((local_30._M_head_impl)->padinfo_).side_ = pVar1;
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001e82b0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x43:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar2;
    ((local_30._M_head_impl)->padinfo_).side_ = pVar1;
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001e8330;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x44:
  case 0x78:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar2;
    ((local_30._M_head_impl)->padinfo_).side_ = pVar1;
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001e83b0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x45:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar2;
    ((local_30._M_head_impl)->padinfo_).side_ = pVar1;
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001e8630;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x46:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar2;
    ((local_30._M_head_impl)->padinfo_).side_ = pVar1;
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001e85f0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x48:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar2;
    ((local_30._M_head_impl)->padinfo_).side_ = pVar1;
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001e8470;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x49:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar2;
    ((local_30._M_head_impl)->padinfo_).side_ = pVar1;
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001e84b0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x4c:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar2;
    ((local_30._M_head_impl)->padinfo_).side_ = pVar1;
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001e8130;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x4d:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar2;
    ((local_30._M_head_impl)->padinfo_).side_ = pVar1;
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001e84f0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x50:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar2;
    ((local_30._M_head_impl)->padinfo_).side_ = pVar1;
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001e87b0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x52:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar2;
    ((local_30._M_head_impl)->padinfo_).side_ = pVar1;
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001e86f0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x53:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar2;
    ((local_30._M_head_impl)->padinfo_).side_ = pVar1;
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001e8530;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x54:
  case 0x58:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar2;
    ((local_30._M_head_impl)->padinfo_).side_ = pVar1;
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001e8730;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x59:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar2;
    ((local_30._M_head_impl)->padinfo_).side_ = pVar1;
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001e8370;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x5e:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar2;
    ((local_30._M_head_impl)->padinfo_).side_ = pVar1;
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001e87f0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x61:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar2;
    ((local_30._M_head_impl)->padinfo_).side_ = pVar1;
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001e81f0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x62:
  case 0x68:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar2;
    ((local_30._M_head_impl)->padinfo_).side_ = pVar1;
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001e8270;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 99:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar2;
    ((local_30._M_head_impl)->padinfo_).side_ = pVar1;
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001e82f0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 100:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar2;
    ((local_30._M_head_impl)->padinfo_).side_ = pVar1;
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001e8430;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x65:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar2;
    ((local_30._M_head_impl)->padinfo_).side_ = pVar1;
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001e8570;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x66:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar2;
    ((local_30._M_head_impl)->padinfo_).side_ = pVar1;
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001e85b0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x6c:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar2;
    ((local_30._M_head_impl)->padinfo_).side_ = pVar1;
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001e80f0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x6d:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar2;
    ((local_30._M_head_impl)->padinfo_).side_ = pVar1;
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001e83f0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x6e:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar2;
    ((local_30._M_head_impl)->padinfo_).side_ = pVar1;
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001e80b0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x70:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar2;
    ((local_30._M_head_impl)->padinfo_).side_ = pVar1;
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001e8670;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x72:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar2;
    ((local_30._M_head_impl)->padinfo_).side_ = pVar1;
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001e86b0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x73:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar2;
    ((local_30._M_head_impl)->padinfo_).side_ = pVar1;
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001e88b0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x74:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar2;
    ((local_30._M_head_impl)->padinfo_).side_ = pVar1;
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001e8170;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x76:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar2;
    ((local_30._M_head_impl)->padinfo_).side_ = pVar1;
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001e81b0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x7a:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x28);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar2;
    ((local_30._M_head_impl)->padinfo_).side_ = pVar1;
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_001e8770;
    local_30._M_head_impl[1]._vptr_flag_formatter = (_func_int **)0x5;
    local_30._M_head_impl[1].padinfo_.width_ = 0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
  }
  if (local_30._M_head_impl != (flag_formatter *)0x0) {
    (*(local_30._M_head_impl)->_vptr_flag_formatter[1])();
  }
  return;
}

Assistant:

void handle_flag_(char flag, details::padding_info padding)
    {
        switch (flag)
        {

        case ('+'): // default formatter
            formatters_.push_back(details::make_unique<details::full_formatter>(padding));
            break;

        case 'n': // logger name
            formatters_.push_back(details::make_unique<details::name_formatter>(padding));
            break;

        case 'l': // level
            formatters_.push_back(details::make_unique<details::level_formatter>(padding));
            break;

        case 'L': // short level
            formatters_.push_back(details::make_unique<details::short_level_formatter>(padding));
            break;

        case ('t'): // thread id
            formatters_.push_back(details::make_unique<details::t_formatter>(padding));
            break;

        case ('v'): // the message text
            formatters_.push_back(details::make_unique<details::v_formatter>(padding));
            break;

        case ('a'): // weekday
            formatters_.push_back(details::make_unique<details::a_formatter>(padding));
            break;

        case ('A'): // short weekday
            formatters_.push_back(details::make_unique<details::A_formatter>(padding));
            break;

        case ('b'):
        case ('h'): // month
            formatters_.push_back(details::make_unique<details::b_formatter>(padding));
            break;

        case ('B'): // short month
            formatters_.push_back(details::make_unique<details::B_formatter>(padding));
            break;

        case ('c'): // datetime
            formatters_.push_back(details::make_unique<details::c_formatter>(padding));
            break;

        case ('C'): // year 2 digits
            formatters_.push_back(details::make_unique<details::C_formatter>(padding));
            break;

        case ('Y'): // year 4 digits
            formatters_.push_back(details::make_unique<details::Y_formatter>(padding));
            break;

        case ('D'):
        case ('x'): // datetime MM/DD/YY
            formatters_.push_back(details::make_unique<details::D_formatter>(padding));
            break;

        case ('m'): // month 1-12
            formatters_.push_back(details::make_unique<details::m_formatter>(padding));
            break;

        case ('d'): // day of month 1-31
            formatters_.push_back(details::make_unique<details::d_formatter>(padding));
            break;

        case ('H'): // hours 24
            formatters_.push_back(details::make_unique<details::H_formatter>(padding));
            break;

        case ('I'): // hours 12
            formatters_.push_back(details::make_unique<details::I_formatter>(padding));
            break;

        case ('M'): // minutes
            formatters_.push_back(details::make_unique<details::M_formatter>(padding));
            break;

        case ('S'): // seconds
            formatters_.push_back(details::make_unique<details::S_formatter>(padding));
            break;

        case ('e'): // milliseconds
            formatters_.push_back(details::make_unique<details::e_formatter>(padding));
            break;

        case ('f'): // microseconds
            formatters_.push_back(details::make_unique<details::f_formatter>(padding));
            break;

        case ('F'): // nanoseconds
            formatters_.push_back(details::make_unique<details::F_formatter>(padding));
            break;

        case ('E'): // seconds since epoch
            formatters_.push_back(details::make_unique<details::E_formatter>(padding));
            break;

        case ('p'): // am/pm
            formatters_.push_back(details::make_unique<details::p_formatter>(padding));
            break;

        case ('r'): // 12 hour clock 02:55:02 pm
            formatters_.push_back(details::make_unique<details::r_formatter>(padding));
            break;

        case ('R'): // 24-hour HH:MM time
            formatters_.push_back(details::make_unique<details::R_formatter>(padding));
            break;

        case ('T'):
        case ('X'): // ISO 8601 time format (HH:MM:SS)
            formatters_.push_back(details::make_unique<details::T_formatter>(padding));
            break;

        case ('z'): // timezone
            formatters_.push_back(details::make_unique<details::z_formatter>(padding));
            break;

        case ('P'): // pid
            formatters_.push_back(details::make_unique<details::pid_formatter>(padding));
            break;

#ifdef SPDLOG_ENABLE_MESSAGE_COUNTER
        case ('i'):
            formatters_.push_back(details::make_unique<details::i_formatter>(padding));
            break;
#endif
        case ('^'): // color range start
            formatters_.push_back(details::make_unique<details::color_start_formatter>(padding));
            break;

        case ('$'): // color range end
            formatters_.push_back(details::make_unique<details::color_stop_formatter>(padding));
            break;

        case ('@'): // source location (filename:filenumber)
            formatters_.push_back(details::make_unique<details::source_location_formatter>(padding));
            break;

        case ('s'): // source filename
            formatters_.push_back(details::make_unique<details::source_filename_formatter>(padding));
            break;

        case ('#'): // source line number
            formatters_.push_back(details::make_unique<details::source_linenum_formatter>(padding));
            break;

        case ('%'): // % char
            formatters_.push_back(details::make_unique<details::ch_formatter>('%'));
            break;

        default: // Unknown flag appears as is
            auto unknown_flag = details::make_unique<details::aggregate_formatter>();
            unknown_flag->add_ch('%');
            unknown_flag->add_ch(flag);
            formatters_.push_back((std::move(unknown_flag)));
            break;
        }
    }